

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmSetPropertyCommand::HandleInstall(cmSetPropertyCommand *this,cmInstalledFile *file)

{
  cmMakefile *mf_00;
  string *prop;
  char *value_00;
  char *value;
  cmMakefile *mf;
  string *name;
  cmInstalledFile *file_local;
  cmSetPropertyCommand *this_local;
  
  prop = &this->PropertyName;
  mf_00 = (this->super_cmCommand).Makefile;
  value_00 = (char *)std::__cxx11::string::c_str();
  if ((this->Remove & 1U) == 0) {
    if ((this->AppendMode & 1U) == 0) {
      cmInstalledFile::SetProperty(file,mf_00,prop,value_00);
    }
    else {
      cmInstalledFile::AppendProperty(file,mf_00,prop,value_00,(bool)(this->AppendAsString & 1));
    }
  }
  else {
    cmInstalledFile::RemoveProperty(file,prop);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleInstall(cmInstalledFile* file)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;

  cmMakefile* mf = this->Makefile;

  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    file->RemoveProperty(name);
  } else if (this->AppendMode) {
    file->AppendProperty(mf, name, value, this->AppendAsString);
  } else {
    file->SetProperty(mf, name, value);
  }
  return true;
}